

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<long_double>::PrepareZ
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *y,TPZFMatrix<long_double> *z,
          longdouble beta,int opt)

{
  long lVar1;
  longdouble *plVar2;
  size_t sVar3;
  long col;
  int64_t i;
  long lVar4;
  long row;
  long lVar5;
  
  lVar1 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar4 = (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (z,lVar1,lVar4);
  col = 0;
  lVar5 = lVar1;
  if (lVar1 < 1) {
    lVar5 = col;
  }
  if (lVar4 < 1) {
    lVar4 = col;
  }
  for (; col != lVar4; col = col + 1) {
    plVar2 = TPZFMatrix<long_double>::operator()(z,0,col);
    if ((beta != (longdouble)0) || (NAN(beta) || NAN((longdouble)0))) {
      if (z != y) {
        memcpy(plVar2,y->fElem + (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * col,
               lVar1 << 4);
      }
      for (row = 0; lVar5 != row; row = row + 1) {
        plVar2 = TPZFMatrix<long_double>::operator()(z,row,col);
        *plVar2 = beta * *plVar2;
      }
    }
    else {
      for (sVar3 = 0; lVar1 << 4 != sVar3; sVar3 = sVar3 + 0x10) {
        *(longdouble *)((long)plVar2 + sVar3) = (longdouble)0;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}